

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_read(uv_fs_t *req)

{
  ssize_t sVar1;
  int *piVar2;
  bool local_29;
  ulong local_28;
  size_t index;
  off_t nread;
  ssize_t result;
  uv_fs_t *req_local;
  
  if (req->off < 0) {
    if (req->nbufs == 1) {
      nread = read(req->file,req->bufs->base,req->bufs->len);
    }
    else {
      nread = readv(req->file,(iovec *)req->bufs,req->nbufs);
    }
  }
  else if (req->nbufs == 1) {
    nread = pread64(req->file,req->bufs->base,req->bufs->len,req->off);
  }
  else {
    if (uv__fs_read::no_preadv == 0) {
      sVar1 = uv__preadv(req->file,(iovec *)req->bufs,req->nbufs,req->off);
      if (sVar1 != -1) {
        return sVar1;
      }
      piVar2 = __errno_location();
      if (*piVar2 != 0x26) {
        return -1;
      }
      uv__fs_read::no_preadv = 1;
    }
    index = 0;
    local_28 = 0;
    nread = 1;
    do {
      if ((req->bufs[local_28].len != 0) &&
         (nread = pread64(req->file,req->bufs[local_28].base,req->bufs[local_28].len,
                          req->off + index), 0 < nread)) {
        index = nread + index;
      }
      local_28 = local_28 + 1;
      local_29 = local_28 < req->nbufs && 0 < nread;
    } while (local_29);
    if (0 < (long)index) {
      nread = index;
    }
  }
  return nread;
}

Assistant:

static ssize_t uv__fs_read(uv_fs_t* req) {
#if defined(__linux__)
  static int no_preadv;
#endif
  ssize_t result;

#if defined(_AIX)
  struct stat buf;
  if(fstat(req->file, &buf))
    return -1;
  if(S_ISDIR(buf.st_mode)) {
    errno = EISDIR;
    return -1;
  }
#endif /* defined(_AIX) */
  if (req->off < 0) {
    if (req->nbufs == 1)
      result = read(req->file, req->bufs[0].base, req->bufs[0].len);
    else
      result = readv(req->file, (struct iovec*) req->bufs, req->nbufs);
  } else {
    if (req->nbufs == 1) {
      result = pread(req->file, req->bufs[0].base, req->bufs[0].len, req->off);
      goto done;
    }

#if HAVE_PREADV
    result = preadv(req->file, (struct iovec*) req->bufs, req->nbufs, req->off);
#else
# if defined(__linux__)
    if (no_preadv) retry:
# endif
    {
      off_t nread;
      size_t index;

      nread = 0;
      index = 0;
      result = 1;
      do {
        if (req->bufs[index].len > 0) {
          result = pread(req->file,
                         req->bufs[index].base,
                         req->bufs[index].len,
                         req->off + nread);
          if (result > 0)
            nread += result;
        }
        index++;
      } while (index < req->nbufs && result > 0);
      if (nread > 0)
        result = nread;
    }
# if defined(__linux__)
    else {
      result = uv__preadv(req->file,
                          (struct iovec*)req->bufs,
                          req->nbufs,
                          req->off);
      if (result == -1 && errno == ENOSYS) {
        no_preadv = 1;
        goto retry;
      }
    }
# endif
#endif
  }

done:
  return result;
}